

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::generateBufferBackedVariableAggregateTypeCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               ProgramInterface interface,ProgramResourcePropFlags targetProp,DataType dataType,
               string *nameSuffix,int depth)

{
  Node *pNVar1;
  Node *pNVar2;
  SharedPtrStateBase *pSVar3;
  ResourceTestCase *this;
  deInt32 *pdVar4;
  SharedPtr structMember;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  ProgramResourceQueryTestTarget local_38;
  
  pNVar2 = (Node *)operator_new(0x28);
  pNVar1 = parentStructure->m_ptr;
  pSVar3 = parentStructure->m_state;
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
  pNVar2->m_type = TYPE_VARIABLE;
  (pNVar2->m_enclosingNode).m_ptr = pNVar1;
  (pNVar2->m_enclosingNode).m_state = pSVar3;
  if (pSVar3 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar4 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
    *pdVar4 = *pdVar4 + 1;
    UNLOCK();
  }
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34c80;
  *(DataType *)&pNVar2[1]._vptr_Node = dataType;
  structMember.m_ptr = pNVar2;
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  structMember.m_state = pSVar3;
  this = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget(&local_38,interface,targetProp);
  std::operator+(&local_58,"var",nameSuffix);
  ResourceTestCase::ResourceTestCase(this,context,&structMember,&local_38,local_58._M_dataplus._M_p)
  ;
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)this);
  pdVar4 = &pSVar3->strongRefCount;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pSVar3 = structMember.m_state;
  LOCK();
  *pdVar4 = *pdVar4 + -1;
  UNLOCK();
  if (*pdVar4 == 0) {
    structMember.m_ptr = (Node *)0x0;
    (*(structMember.m_state)->_vptr_SharedPtrStateBase[2])(structMember.m_state);
  }
  LOCK();
  pdVar4 = &pSVar3->weakRefCount;
  *pdVar4 = *pdVar4 + -1;
  UNLOCK();
  if ((*pdVar4 == 0) && (structMember.m_state != (SharedPtrStateBase *)0x0)) {
    (*(structMember.m_state)->_vptr_SharedPtrStateBase[1])();
  }
  if (0 < depth) {
    pNVar2 = (Node *)operator_new(0x20);
    pNVar1 = parentStructure->m_ptr;
    pSVar3 = parentStructure->m_state;
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar2->m_type = TYPE_STRUCT_MEMBER;
    (pNVar2->m_enclosingNode).m_ptr = pNVar1;
    (pNVar2->m_enclosingNode).m_state = pSVar3;
    if (pSVar3 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar4 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
      *pdVar4 = *pdVar4 + 1;
      UNLOCK();
    }
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34d08;
    structMember.m_state = (SharedPtrStateBase *)0x0;
    structMember.m_ptr = pNVar2;
    pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar3->strongRefCount = 0;
    pSVar3->weakRefCount = 0;
    pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
    pSVar3->strongRefCount = 1;
    pSVar3->weakRefCount = 1;
    structMember.m_state = pSVar3;
    std::operator+(&local_58,"_struct",nameSuffix);
    generateBufferBackedVariableAggregateTypeCases
              (context,&structMember,targetGroup,interface,targetProp,dataType,&local_58,depth + -1)
    ;
    pdVar4 = &pSVar3->strongRefCount;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    pSVar3 = structMember.m_state;
    LOCK();
    *pdVar4 = *pdVar4 + -1;
    UNLOCK();
    if (*pdVar4 == 0) {
      structMember.m_ptr = (Node *)0x0;
      (*(structMember.m_state)->_vptr_SharedPtrStateBase[2])(structMember.m_state);
    }
    LOCK();
    pdVar4 = &pSVar3->weakRefCount;
    *pdVar4 = *pdVar4 + -1;
    UNLOCK();
    if ((*pdVar4 == 0) && (structMember.m_state != (SharedPtrStateBase *)0x0)) {
      (*(structMember.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    pNVar2 = (Node *)operator_new(0x28);
    pNVar1 = parentStructure->m_ptr;
    pSVar3 = parentStructure->m_state;
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    pNVar2->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar2->m_enclosingNode).m_ptr = pNVar1;
    (pNVar2->m_enclosingNode).m_state = pSVar3;
    if (pSVar3 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar4 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
      *pdVar4 = *pdVar4 + 1;
      UNLOCK();
    }
    pNVar2->_vptr_Node = (_func_int **)&PTR__Node_00b34c48;
    *(undefined4 *)&pNVar2[1]._vptr_Node = 0xffffffff;
    structMember.m_state = (SharedPtrStateBase *)0x0;
    structMember.m_ptr = pNVar2;
    pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar3->strongRefCount = 0;
    pSVar3->weakRefCount = 0;
    pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
    pSVar3->strongRefCount = 1;
    pSVar3->weakRefCount = 1;
    structMember.m_state = pSVar3;
    std::operator+(&local_58,"_array",nameSuffix);
    generateBufferBackedVariableAggregateTypeCases
              (context,&structMember,targetGroup,interface,targetProp,dataType,&local_58,depth + -1)
    ;
    pdVar4 = &pSVar3->strongRefCount;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    pSVar3 = structMember.m_state;
    LOCK();
    *pdVar4 = *pdVar4 + -1;
    UNLOCK();
    if (*pdVar4 == 0) {
      structMember.m_ptr = (Node *)0x0;
      (*(structMember.m_state)->_vptr_SharedPtrStateBase[2])(structMember.m_state);
    }
    LOCK();
    pdVar4 = &pSVar3->weakRefCount;
    *pdVar4 = *pdVar4 + -1;
    UNLOCK();
    if ((*pdVar4 == 0) && (structMember.m_state != (SharedPtrStateBase *)0x0)) {
      (*(structMember.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

static void generateBufferBackedVariableAggregateTypeCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup, ProgramInterface interface, ProgramResourcePropFlags targetProp, glu::DataType dataType, const std::string& nameSuffix, int depth)
{
	// variable
	{
		const ResourceDefinition::Node::SharedPtr variable(new ResourceDefinition::Variable(parentStructure, dataType));
		targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(interface, targetProp), ("var" + nameSuffix).c_str()));
	}

	// struct
	if (depth > 0)
	{
		const ResourceDefinition::Node::SharedPtr structMember(new ResourceDefinition::StructMember(parentStructure));
		generateBufferBackedVariableAggregateTypeCases(context, structMember, targetGroup, interface, targetProp, dataType, "_struct" + nameSuffix, depth - 1);
	}

	// array
	if (depth > 0)
	{
		const ResourceDefinition::Node::SharedPtr arrayElement(new ResourceDefinition::ArrayElement(parentStructure));
		generateBufferBackedVariableAggregateTypeCases(context, arrayElement, targetGroup, interface, targetProp, dataType, "_array" + nameSuffix, depth - 1);
	}
}